

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# localizer.cpp
# Opt level: O3

void __thiscall
ary::PlanarLocalization::draw(PlanarLocalization *this,Mat *image,SharedCameraModel *model)

{
  pointer pPVar1;
  ulong uVar2;
  ulong uVar3;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  SharedCameraModel *local_98;
  undefined4 local_90 [2];
  Mat *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  pPVar1 = (this->corners).
           super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = (long)(this->corners).
                super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pPVar1;
  local_98 = model;
  if (8 < uVar2) {
    uVar3 = 1;
    local_78 = 0;
    uStack_74 = 0;
    uStack_70 = 0;
    uStack_6c = 0x406fe000;
    do {
      local_80 = 0;
      local_90[0] = 0x3010000;
      local_a0 = (int)ROUND(pPVar1[uVar3 - 1].x);
      local_9c = (int)ROUND(pPVar1[uVar3 - 1].y);
      local_a8 = (int)ROUND(pPVar1[uVar3].x);
      local_a4 = (int)ROUND(pPVar1[uVar3].y);
      local_68 = CONCAT44(uStack_74,local_78);
      uStack_60 = CONCAT44(uStack_6c,uStack_70);
      local_58 = 0;
      uStack_50 = 0;
      local_88 = image;
      cv::line(local_90,&local_a0,&local_a8,&local_68,4,8,0);
      uVar3 = uVar3 + 1;
      pPVar1 = (this->corners).
               super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar2 = (long)(this->corners).
                    super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1;
    } while (uVar3 < (ulong)((long)uVar2 >> 3));
  }
  local_80 = 0;
  local_90[0] = 0x3010000;
  local_38 = (int)ROUND(*(float *)((long)&pPVar1[-1].x + uVar2));
  local_34 = (int)ROUND(*(float *)((long)pPVar1 + (uVar2 - 4)));
  local_40 = (int)ROUND(pPVar1->x);
  local_3c = (int)ROUND(pPVar1->y);
  local_68 = 0;
  uStack_60 = 0x406fe00000000000;
  local_58 = 0;
  uStack_50 = 0;
  local_88 = image;
  cv::line();
  Localization::draw(&this->super_Localization,image,local_98);
  return;
}

Assistant:

void PlanarLocalization::draw(cv::Mat& image, SharedCameraModel& model) const {


    for (int i = 1; i < corners.size(); i++) {
	    line(image, corners[i-1], corners[i], Scalar(0, 255, 0), 4);
    }
    line(image, corners[corners.size()-1], corners[0], Scalar(0, 255, 0), 4);

    Localization::draw(image, model);

}